

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlAutoCloseOnEnd(htmlParserCtxtPtr ctxt)

{
  int local_14;
  int i;
  htmlParserCtxtPtr ctxt_local;
  
  if (ctxt->nameNr != 0) {
    local_14 = ctxt->nameNr;
    while (local_14 = local_14 + -1, -1 < local_14) {
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->sax->endElement != (endElementSAXFunc)0x0))
      {
        (*ctxt->sax->endElement)(ctxt->userData,ctxt->name);
      }
      htmlnamePop(ctxt);
    }
  }
  return;
}

Assistant:

static void
htmlAutoCloseOnEnd(htmlParserCtxtPtr ctxt)
{
    int i;

    if (ctxt->nameNr == 0)
        return;
    for (i = (ctxt->nameNr - 1); i >= 0; i--) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}